

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall read_bm_0::operator()(read_bm_0 *this,xr_bone_motion **bm,xr_reader *r)

{
  xr_bone_motion *this_00;
  char local_28 [8];
  char name [8];
  xr_reader *r_local;
  xr_bone_motion **bm_local;
  read_bm_0 *this_local;
  
  this->index = this->index + 1;
  name = (char  [8])r;
  snprintf(local_28,8,"%d");
  this_00 = (xr_bone_motion *)operator_new(0x60);
  xray_re::xr_bone_motion::xr_bone_motion(this_00,local_28);
  *bm = this_00;
  xray_re::xr_bone_motion::load_0(*bm,(xr_reader *)name);
  return;
}

Assistant:

void operator()(xr_bone_motion*& bm, xr_reader& r) {
		char name[8];
		xr_snprintf(name, sizeof(name), "%d", index++);
		bm = new xr_bone_motion(name);
		bm->load_0(r);
	}